

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

JavascriptProxy * Js::JavascriptProxy::UnwrapNestedProxies(JavascriptProxy *proxy)

{
  bool bVar1;
  JavascriptProxy *this;
  WriteBarrierPtr<Js::RecyclableObject> local_20;
  
  while( true ) {
    this = proxy;
    bVar1 = IsRevoked(this);
    if (bVar1) {
      return this;
    }
    Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&local_20,(this->target).ptr);
    bVar1 = VarIs<Js::JavascriptProxy>(local_20.ptr);
    if (!bVar1) break;
    proxy = UnsafeVarTo<Js::JavascriptProxy>(local_20.ptr);
    if (proxy == (JavascriptProxy *)0x0) {
      return this;
    }
  }
  return this;
}

Assistant:

const JavascriptProxy* JavascriptProxy::UnwrapNestedProxies(const JavascriptProxy* proxy)
    {
        // continue while we have a proxy that is not revoked
        while (!proxy->IsRevoked())
        {
            JavascriptProxy* nestedProxy = JavascriptOperators::TryFromVar<JavascriptProxy>(proxy->target);
            if (nestedProxy == nullptr)
            {
                break;
            }

            proxy = nestedProxy;
        }

        return proxy;
    }